

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2int8.cpp
# Opt level: O1

int __thiscall NetQuantize::quantize_convolutiondepthwise(NetQuantize *this)

{
  pointer *ppiVar1;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar2;
  Layer *pLVar3;
  void *__ptr;
  pointer pMVar4;
  pointer pMVar5;
  void *__ptr_00;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  Allocator *pAVar8;
  pointer pMVar9;
  int *piVar10;
  pointer __ptr_01;
  long *plVar11;
  bool bVar12;
  int iVar13;
  int iVar14;
  iterator iVar15;
  size_t sVar16;
  iterator iVar17;
  int iVar18;
  void *pvVar19;
  long lVar20;
  size_t sVar21;
  ulong uVar22;
  uint uVar23;
  ulong uVar24;
  int unaff_R14D;
  long lVar25;
  bool bVar26;
  bool bVar27;
  Option opt_q;
  char key [256];
  undefined1 local_328 [32];
  Allocator *local_308;
  int iStack_300;
  int local_2fc;
  int iStack_2f8;
  int iStack_2f4;
  int iStack_2f0;
  size_t local_2e8;
  undefined4 local_2dc;
  undefined4 local_2d8;
  undefined4 local_2d4;
  ulong local_2d0;
  Mat local_2c8;
  Mat local_278;
  Mat local_228;
  pointer local_1d8;
  undefined8 local_1d0;
  pointer local_1c8;
  _Base_ptr local_1c0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
  *local_1b8;
  Option *local_1b0;
  _Base_ptr local_1a8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
  *local_1a0;
  undefined4 local_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined8 local_188;
  undefined8 uStack_180;
  Option local_178;
  char local_138 [264];
  
  pvVar2 = (this->super_ModelWriter).layers;
  uVar23 = (uint)((ulong)((long)(pvVar2->
                                super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(pvVar2->
                               super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                               _M_impl.super__Vector_impl_data._M_start) >> 3);
  if (0 < (int)uVar23) {
    local_1a0 = &this->blob_int8scale_table;
    local_1a8 = &(this->blob_int8scale_table)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_1b8 = &this->weight_int8scale_table;
    local_1c0 = &(this->weight_int8scale_table)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_1b0 = &(this->super_ModelWriter).super_Net.opt;
    uVar24 = (ulong)(uVar23 & 0x7fffffff);
    uVar22 = 0;
    do {
      iVar13 = std::__cxx11::string::compare
                         ((char *)&(((this->super_ModelWriter).layers)->
                                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start[uVar22]->type);
      iVar18 = unaff_R14D;
      if (iVar13 == 0) {
        iVar15 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
                 ::find(&local_1a0->_M_t,
                        &(((this->super_ModelWriter).layers)->
                         super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                         super__Vector_impl_data._M_start[uVar22]->name);
        bVar12 = false;
        if (iVar15._M_node != local_1a8) {
          sprintf(local_138,"%s_param_0",
                  ((((this->super_ModelWriter).layers)->
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar22]->name)._M_dataplus._M_p);
          local_328._0_8_ = local_328 + 0x10;
          sVar16 = strlen(local_138);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_328,local_138,local_138 + sVar16);
          iVar17 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
                   ::find(&local_1b8->_M_t,(key_type *)local_328);
          if ((undefined1 *)local_328._0_8_ != local_328 + 0x10) {
            operator_delete((void *)local_328._0_8_);
          }
          if (iVar17._M_node == local_1c0) {
            quantize_convolutiondepthwise();
            iVar18 = -1;
            bVar12 = true;
          }
          else {
            pLVar3 = (((this->super_ModelWriter).layers)->
                     super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                     super__Vector_impl_data._M_start[uVar22];
            __ptr = *(void **)(iVar15._M_node + 2);
            pMVar4 = (pointer)iVar15._M_node[2]._M_parent;
            local_1c8 = (pointer)iVar15._M_node[2]._M_left;
            local_2d4 = *(undefined4 *)&iVar15._M_node[2]._M_right;
            pMVar5 = *(pointer *)(iVar15._M_node + 3);
            local_188 = iVar15._M_node[3]._M_parent;
            uStack_180 = iVar15._M_node[3]._M_left;
            local_2d8 = *(undefined4 *)&iVar15._M_node[3]._M_right;
            local_1d0 = *(undefined8 *)(iVar15._M_node + 4);
            if (pMVar4 != (pointer)0x0) {
              LOCK();
              *(_Rb_tree_color *)&pMVar4->data = *(_Rb_tree_color *)&pMVar4->data + _S_black;
              UNLOCK();
            }
            __ptr_00 = *(void **)(iVar17._M_node + 2);
            p_Var6 = iVar17._M_node[2]._M_parent;
            p_Var7 = iVar17._M_node[2]._M_left;
            iVar13 = *(int *)&iVar17._M_node[2]._M_right;
            pAVar8 = *(Allocator **)(iVar17._M_node + 3);
            local_198 = *(undefined4 *)&iVar17._M_node[3]._M_parent;
            uStack_194 = *(undefined4 *)((long)&iVar17._M_node[3]._M_parent + 4);
            uStack_190 = *(undefined4 *)&iVar17._M_node[3]._M_left;
            uStack_18c = *(undefined4 *)((long)&iVar17._M_node[3]._M_left + 4);
            local_2dc = *(undefined4 *)&iVar17._M_node[3]._M_right;
            local_1d8 = *(pointer *)(iVar17._M_node + 4);
            if (p_Var6 != (_Base_ptr)0x0) {
              LOCK();
              p_Var6->_M_color = p_Var6->_M_color + _S_black;
              UNLOCK();
            }
            fprintf(_stderr,"quantize_convolutiondepthwise %s\n",(pLVar3->name)._M_dataplus._M_p);
            local_2e8 = 0;
            local_328._0_8_ = (pointer)0x0;
            local_328._8_4_ = 0;
            local_328._12_4_ = 0;
            local_328._16_4_ = 0;
            local_328._20_4_ = 0;
            local_328._24_4_ = 0;
            iStack_2f8 = 0;
            iStack_2f4 = 0;
            iStack_2f0 = 0;
            local_308 = (Allocator *)0x0;
            iStack_300 = 0;
            local_2fc = 0;
            ncnn::Mat::create((Mat *)local_328,*(int *)((long)&pLVar3[1].type._M_dataplus._M_p + 4),
                              1,(Allocator *)0x0);
            bVar26 = (pointer)local_328._0_8_ != (pointer)0x0;
            bVar27 = (long)iStack_2f0 * local_2e8 != 0;
            iVar18 = -100;
            if (bVar26 && bVar27) {
              iVar18 = (int)pLVar3[1].type._M_string_length;
              iVar14 = *(int *)((long)&pLVar3[1].type._M_dataplus._M_p + 4) / iVar18;
              local_2d0 = uVar24;
              if (0 < iVar18) {
                sVar21 = (size_t)iVar14;
                lVar20 = 0;
                lVar25 = 0;
                pvVar19 = __ptr_00;
                do {
                  local_178.lightmode = local_1b0->lightmode;
                  local_178._1_3_ = *(undefined3 *)&local_1b0->field_0x1;
                  local_178.num_threads = local_1b0->num_threads;
                  local_178.workspace_allocator = local_1b0->workspace_allocator;
                  local_178.openmp_blocktime = local_1b0->openmp_blocktime;
                  local_178.use_winograd_convolution = local_1b0->use_winograd_convolution;
                  local_178.use_sgemm_convolution = local_1b0->use_sgemm_convolution;
                  local_178.use_int8_inference = local_1b0->use_int8_inference;
                  local_178.use_vulkan_compute = local_1b0->use_vulkan_compute;
                  uVar24._0_1_ = local_1b0->use_bf16_storage;
                  uVar24._1_1_ = local_1b0->use_fp16_packed;
                  uVar24._2_1_ = local_1b0->use_fp16_storage;
                  uVar24._3_1_ = local_1b0->use_fp16_arithmetic;
                  uVar24._4_1_ = local_1b0->use_int8_packed;
                  uVar24._5_1_ = local_1b0->use_int8_storage;
                  uVar24._6_1_ = local_1b0->use_int8_arithmetic;
                  uVar24._7_1_ = local_1b0->use_packing_layout;
                  local_178.use_shader_pack8 = local_1b0->use_shader_pack8;
                  local_178.use_subgroup_basic = local_1b0->use_subgroup_basic;
                  local_178.use_subgroup_vote = local_1b0->use_subgroup_vote;
                  local_178.use_subgroup_ballot = local_1b0->use_subgroup_ballot;
                  local_178.use_subgroup_shuffle = local_1b0->use_subgroup_shuffle;
                  local_178.use_image_storage = local_1b0->use_image_storage;
                  local_178.use_tensor_storage = local_1b0->use_tensor_storage;
                  local_178.use_reserved_0 = local_1b0->use_reserved_0;
                  local_178.flush_denormals = local_1b0->flush_denormals;
                  local_178.use_local_pool_allocator = local_1b0->use_local_pool_allocator;
                  local_178.use_shader_local_memory = local_1b0->use_shader_local_memory;
                  local_178.use_cooperative_matrix = local_1b0->use_cooperative_matrix;
                  local_178.use_winograd23_convolution = local_1b0->use_winograd23_convolution;
                  local_178.use_winograd43_convolution = local_1b0->use_winograd43_convolution;
                  local_178.use_winograd63_convolution = local_1b0->use_winograd63_convolution;
                  local_178.use_a53_a55_optimized_kernel = local_1b0->use_a53_a55_optimized_kernel;
                  local_178.use_reserved_7 = local_1b0->use_reserved_7;
                  local_178.use_reserved_8 = local_1b0->use_reserved_8;
                  local_178.use_reserved_9 = local_1b0->use_reserved_9;
                  local_178.use_reserved_10 = local_1b0->use_reserved_10;
                  local_178.use_reserved_11 = local_1b0->use_reserved_11;
                  local_178.blob_allocator = local_308;
                  local_178._32_8_ = uVar24 & 0xffffffffffffff;
                  pMVar9 = pLVar3[1].bottom_shapes.
                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                           super__Vector_impl_data._M_finish;
                  local_278.data =
                       (void *)((long)pMVar9 * lVar20 +
                               (long)pLVar3[1].tops.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage);
                  local_278.elempack =
                       *(int *)&pLVar3[1].bottom_shapes.
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage;
                  local_278.allocator =
                       *(Allocator **)
                        &pLVar3[1].top_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data;
                  local_278.refcount._0_4_ = 0;
                  local_278.refcount._4_4_ = 0;
                  local_278.elemsize._0_4_ = SUB84(pMVar9,0);
                  local_278.elemsize._4_4_ = (undefined4)((ulong)pMVar9 >> 0x20);
                  local_2c8.data =
                       (void *)(local_328._0_8_ +
                               CONCAT44(local_328._20_4_,local_328._16_4_) * lVar20);
                  local_2c8.refcount._0_4_ = 0;
                  local_2c8.refcount._4_4_ = 0;
                  local_2c8.elemsize._0_4_ = local_328._16_4_;
                  local_2c8.elemsize._4_4_ = local_328._20_4_;
                  local_2c8.elempack = local_328._24_4_;
                  local_2c8.allocator = local_308;
                  local_278.w = iVar14;
                  local_278.dims = 1;
                  local_278.h = 1;
                  local_278.d = 1;
                  local_278.c = 1;
                  local_2c8.w = iVar14;
                  local_2c8.dims = 1;
                  local_2c8.h = 1;
                  local_2c8.d = 1;
                  local_2c8.c = 1;
                  local_228.refcount._0_4_ = 0;
                  local_228.refcount._4_4_ = 0;
                  local_228.elemsize._0_4_ = SUB84(p_Var7,0);
                  local_228.elemsize._4_4_ = (undefined4)((ulong)p_Var7 >> 0x20);
                  local_228.dims = 1;
                  local_228.w = 1;
                  local_228.h = 1;
                  local_228.d = 1;
                  local_228.c = 1;
                  local_228.cstep = 1;
                  local_2c8.cstep = sVar21;
                  local_278.cstep = sVar21;
                  local_228.data = pvVar19;
                  local_228.elempack = iVar13;
                  local_228.allocator = pAVar8;
                  ncnn::quantize_to_int8(&local_278,&local_2c8,&local_228,&local_178);
                  piVar10 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
                  if (piVar10 != (int *)0x0) {
                    LOCK();
                    *piVar10 = *piVar10 + -1;
                    UNLOCK();
                    if (*piVar10 == 0) {
                      if (local_228.allocator == (Allocator *)0x0) {
                        if (local_228.data != (void *)0x0) {
                          free(local_228.data);
                        }
                      }
                      else {
                        (*(local_228.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  local_228.cstep = 0;
                  local_228.data = (void *)0x0;
                  local_228.refcount._0_4_ = 0;
                  local_228.refcount._4_4_ = 0;
                  local_228.elemsize._0_4_ = 0;
                  local_228.elemsize._4_4_ = 0;
                  local_228.elempack = 0;
                  local_228.dims = 0;
                  local_228.w = 0;
                  local_228.h = 0;
                  local_228.d = 0;
                  local_228.c = 0;
                  piVar10 = (int *)CONCAT44(local_2c8.refcount._4_4_,local_2c8.refcount._0_4_);
                  if (piVar10 != (int *)0x0) {
                    LOCK();
                    *piVar10 = *piVar10 + -1;
                    UNLOCK();
                    if (*piVar10 == 0) {
                      if (local_2c8.allocator == (Allocator *)0x0) {
                        if ((pointer)local_2c8.data != (pointer)0x0) {
                          free(local_2c8.data);
                        }
                      }
                      else {
                        (*(local_2c8.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  local_2c8.cstep = 0;
                  local_2c8.data = (void *)0x0;
                  local_2c8.refcount._0_4_ = 0;
                  local_2c8.refcount._4_4_ = 0;
                  local_2c8.elemsize._0_4_ = 0;
                  local_2c8.elemsize._4_4_ = 0;
                  local_2c8.elempack = 0;
                  local_2c8.dims = 0;
                  local_2c8.w = 0;
                  local_2c8.h = 0;
                  local_2c8.d = 0;
                  local_2c8.c = 0;
                  piVar10 = (int *)CONCAT44(local_278.refcount._4_4_,local_278.refcount._0_4_);
                  if (piVar10 != (int *)0x0) {
                    LOCK();
                    *piVar10 = *piVar10 + -1;
                    UNLOCK();
                    if (*piVar10 == 0) {
                      if (local_278.allocator == (Allocator *)0x0) {
                        if ((pointer)local_278.data != (pointer)0x0) {
                          free(local_278.data);
                        }
                      }
                      else {
                        (*(local_278.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  local_278.cstep = 0;
                  local_278.data = (void *)0x0;
                  local_278.refcount._0_4_ = 0;
                  local_278.refcount._4_4_ = 0;
                  local_278.elemsize._0_4_ = 0;
                  local_278.elemsize._4_4_ = 0;
                  local_278.elempack = 0;
                  local_278.dims = 0;
                  local_278.w = 0;
                  local_278.h = 0;
                  local_278.d = 0;
                  local_278.c = 0;
                  lVar25 = lVar25 + 1;
                  lVar20 = lVar20 + sVar21;
                  pvVar19 = (void *)((long)pvVar19 + (long)p_Var7);
                } while (lVar25 < (int)pLVar3[1].type._M_string_length);
              }
              uVar24 = local_2d0;
              ppiVar1 = &pLVar3[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
              iVar18 = unaff_R14D;
              if (ppiVar1 != (pointer *)local_328) {
                piVar10 = (int *)CONCAT44(local_328._12_4_,local_328._8_4_);
                if (piVar10 != (int *)0x0) {
                  LOCK();
                  *piVar10 = *piVar10 + 1;
                  UNLOCK();
                }
                piVar10 = *(int **)&pLVar3[1].bottom_shapes.
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                    _M_impl.super__Vector_impl_data;
                if (piVar10 != (int *)0x0) {
                  LOCK();
                  *piVar10 = *piVar10 + -1;
                  UNLOCK();
                  if (*piVar10 == 0) {
                    __ptr_01 = pLVar3[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage;
                    plVar11 = *(long **)&pLVar3[1].top_shapes.
                                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                         _M_impl.super__Vector_impl_data;
                    if (plVar11 == (long *)0x0) {
                      if (__ptr_01 != (pointer)0x0) {
                        free(__ptr_01);
                      }
                    }
                    else {
                      (**(code **)(*plVar11 + 0x18))();
                    }
                  }
                }
                pLVar3[2].one_blob_only = false;
                pLVar3[2].support_inplace = false;
                pLVar3[2].support_vulkan = false;
                pLVar3[2].support_packing = false;
                pLVar3[2].support_bf16_storage = false;
                pLVar3[2].support_fp16_storage = false;
                pLVar3[2].support_int8_storage = false;
                pLVar3[2].support_image_storage = false;
                *(undefined8 *)
                 ((long)&pLVar3[1].bottom_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data._M_start + 4) = 0;
                *(undefined8 *)
                 ((long)&pLVar3[1].bottom_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data._M_finish + 4) = 0;
                *ppiVar1 = (pointer)0x0;
                pLVar3[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_start = 0;
                pLVar3[1].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                pLVar3[1].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                *(undefined4 *)&pLVar3[2]._vptr_Layer = 0;
                pLVar3[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)local_328._0_8_;
                *(ulong *)&pLVar3[1].bottom_shapes.
                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                           super__Vector_impl_data = CONCAT44(local_328._12_4_,local_328._8_4_);
                pLVar3[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_finish =
                     (pointer)CONCAT44(local_328._20_4_,local_328._16_4_);
                *(undefined4 *)
                 &pLVar3[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage = local_328._24_4_;
                *(Allocator **)
                 &pLVar3[1].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data = local_308;
                pLVar3[1].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_finish = (pointer)CONCAT44(local_2fc,iStack_300);
                pLVar3[1].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage =
                     (pointer)CONCAT44(iStack_2f4,iStack_2f8);
                *(int *)&pLVar3[2]._vptr_Layer = iStack_2f0;
                pLVar3[2].one_blob_only = (bool)(undefined1)local_2e8;
                pLVar3[2].support_inplace = (bool)local_2e8._1_1_;
                pLVar3[2].support_vulkan = (bool)local_2e8._2_1_;
                pLVar3[2].support_packing = (bool)local_2e8._3_1_;
                pLVar3[2].support_bf16_storage = (bool)local_2e8._4_1_;
                pLVar3[2].support_fp16_storage = (bool)local_2e8._5_1_;
                pLVar3[2].support_int8_storage = (bool)local_2e8._6_1_;
                pLVar3[2].support_image_storage = (bool)local_2e8._7_1_;
              }
            }
            piVar10 = (int *)CONCAT44(local_328._12_4_,local_328._8_4_);
            if (piVar10 != (int *)0x0) {
              LOCK();
              *piVar10 = *piVar10 + -1;
              UNLOCK();
              if (*piVar10 == 0) {
                if (local_308 == (Allocator *)0x0) {
                  if ((pointer)local_328._0_8_ != (pointer)0x0) {
                    free((void *)local_328._0_8_);
                  }
                }
                else {
                  (*local_308->_vptr_Allocator[3])();
                }
              }
            }
            local_2e8 = 0;
            local_328._0_8_ = (pointer)0x0;
            local_328._8_4_ = 0;
            local_328._12_4_ = 0;
            local_328._16_4_ = 0;
            local_328._20_4_ = 0;
            local_328._24_4_ = 0;
            iStack_300 = 0;
            local_2fc = 0;
            iStack_2f8 = 0;
            iStack_2f4 = 0;
            iStack_2f0 = 0;
            bVar12 = true;
            if (bVar26 && bVar27) {
              *(undefined4 *)((long)&pLVar3[1].type._M_string_length + 4) = 1;
              if (p_Var6 != (_Base_ptr)0x0) {
                LOCK();
                p_Var6->_M_color = p_Var6->_M_color + _S_black;
                UNLOCK();
              }
              piVar10 = *(int **)&pLVar3[2].name.field_2;
              if (piVar10 != (int *)0x0) {
                LOCK();
                *piVar10 = *piVar10 + -1;
                UNLOCK();
                if (*piVar10 == 0) {
                  pvVar19 = (void *)pLVar3[2].name._M_string_length;
                  plVar11 = (long *)pLVar3[2].bottoms.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish;
                  if (plVar11 == (long *)0x0) {
                    if (pvVar19 != (void *)0x0) {
                      free(pvVar19);
                    }
                  }
                  else {
                    (**(code **)(*plVar11 + 0x18))();
                  }
                }
              }
              pLVar3[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              *(undefined8 *)((long)&pLVar3[2].name.field_2 + 4) = 0;
              *(undefined8 *)((long)&pLVar3[2].name.field_2 + 0xc) = 0;
              pLVar3[2].name._M_string_length = 0;
              pLVar3[2].name.field_2._M_allocated_capacity = 0;
              pLVar3[2].name._M_string_length = (size_type)__ptr_00;
              pLVar3[2].name.field_2._M_allocated_capacity = (size_type)p_Var6;
              *(_Base_ptr *)((long)&pLVar3[2].name.field_2 + 8) = p_Var7;
              *(int *)&pLVar3[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data = iVar13;
              pLVar3[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)pAVar8;
              *(undefined4 *)
               &pLVar3[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = local_198;
              *(undefined4 *)
               ((long)&pLVar3[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 4) = uStack_194;
              *(undefined4 *)
               &pLVar3[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data = uStack_190;
              *(undefined4 *)
               ((long)&pLVar3[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start + 4) = uStack_18c;
              *(undefined4 *)
               &pLVar3[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = local_2dc;
              pLVar3[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = local_1d8;
              if (pMVar4 != (pointer)0x0) {
                LOCK();
                *(_Rb_tree_color *)&pMVar4->data = *(_Rb_tree_color *)&pMVar4->data + _S_black;
                UNLOCK();
              }
              pMVar9 = pLVar3[2].bottom_shapes.
                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              if (pMVar9 != (pointer)0x0) {
                LOCK();
                *(int *)&pMVar9->data = *(int *)&pMVar9->data + -1;
                UNLOCK();
                if (*(int *)&pMVar9->data == 0) {
                  pvVar19 = pLVar3[2].bottom_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  pMVar9 = pLVar3[2].top_shapes.
                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                           super__Vector_impl_data._M_finish;
                  if (pMVar9 == (pointer)0x0) {
                    if (pvVar19 != (void *)0x0) {
                      free(pvVar19);
                    }
                  }
                  else {
                    (**(code **)((long)pMVar9->data + 0x18))();
                  }
                }
              }
              pLVar3[3].support_tensor_storage = false;
              pLVar3[3].support_reserved_00 = false;
              pLVar3[3].support_reserved_0 = false;
              pLVar3[3].support_reserved_1 = false;
              pLVar3[3].support_reserved_2 = false;
              pLVar3[3].support_reserved_3 = false;
              pLVar3[3].support_reserved_4 = false;
              pLVar3[3].support_reserved_5 = false;
              *(undefined8 *)
               ((long)&pLVar3[2].bottom_shapes.
                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                       super__Vector_impl_data._M_finish + 4) = 0;
              *(undefined8 *)
               ((long)&pLVar3[2].bottom_shapes.
                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 4) = 0;
              pLVar3[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
              _M_impl.super__Vector_impl_data._M_start = 0;
              pLVar3[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              pLVar3[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
              _M_impl.super__Vector_impl_data._M_start = __ptr;
              pLVar3[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
              _M_impl.super__Vector_impl_data._M_finish = pMVar4;
              pLVar3[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = local_1c8;
              *(undefined4 *)
               &pLVar3[2].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data = local_2d4;
              pLVar3[2].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
              .super__Vector_impl_data._M_finish = pMVar5;
              *(undefined4 *)
               &pLVar3[2].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (undefined4)local_188;
              *(undefined4 *)
               ((long)&pLVar3[2].top_shapes.
                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 4) = local_188._4_4_;
              *(undefined4 *)&pLVar3[3]._vptr_Layer = (undefined4)uStack_180;
              *(undefined4 *)((long)&pLVar3[3]._vptr_Layer + 4) = uStack_180._4_4_;
              pLVar3[3].one_blob_only = (bool)(undefined1)local_2d8;
              pLVar3[3].support_inplace = (bool)local_2d8._1_1_;
              pLVar3[3].support_vulkan = (bool)local_2d8._2_1_;
              pLVar3[3].support_packing = (bool)local_2d8._3_1_;
              pLVar3[3].support_tensor_storage = (bool)(undefined1)local_1d0;
              pLVar3[3].support_reserved_00 = (bool)local_1d0._1_1_;
              pLVar3[3].support_reserved_0 = (bool)local_1d0._2_1_;
              pLVar3[3].support_reserved_1 = (bool)local_1d0._3_1_;
              pLVar3[3].support_reserved_2 = (bool)local_1d0._4_1_;
              pLVar3[3].support_reserved_3 = (bool)local_1d0._5_1_;
              pLVar3[3].support_reserved_4 = (bool)local_1d0._6_1_;
              pLVar3[3].support_reserved_5 = (bool)local_1d0._7_1_;
              bVar12 = false;
            }
            if (p_Var6 != (_Base_ptr)0x0) {
              LOCK();
              p_Var6->_M_color = p_Var6->_M_color - _S_black;
              UNLOCK();
              if (p_Var6->_M_color == _S_red) {
                if (pAVar8 == (Allocator *)0x0) {
                  if (__ptr_00 != (void *)0x0) {
                    free(__ptr_00);
                  }
                }
                else {
                  (*pAVar8->_vptr_Allocator[3])(pAVar8,__ptr_00);
                }
              }
            }
            if (pMVar4 != (pointer)0x0) {
              LOCK();
              *(_Rb_tree_color *)&pMVar4->data = *(_Rb_tree_color *)&pMVar4->data - _S_black;
              UNLOCK();
              if (*(_Rb_tree_color *)&pMVar4->data == _S_red) {
                if (pMVar5 == (pointer)0x0) {
                  if (__ptr != (void *)0x0) {
                    free(__ptr);
                  }
                }
                else {
                  (**(code **)((long)pMVar5->data + 0x18))(pMVar5,__ptr);
                }
              }
            }
          }
        }
        if (bVar12) {
          return iVar18;
        }
      }
      uVar22 = uVar22 + 1;
      unaff_R14D = iVar18;
    } while (uVar22 != uVar24);
  }
  return 0;
}

Assistant:

int NetQuantize::quantize_convolutiondepthwise()
{
    const int layer_count = static_cast<int>(layers.size());
    for (int i = 0; i < layer_count; i++)
    {
        // find convolution layer
        if (layers[i]->type != "ConvolutionDepthWise")
            continue;

        // find convolutiondepthwise layer
        std::map<std::string, ncnn::Mat>::iterator iter_data = blob_int8scale_table.find(layers[i]->name);
        if (iter_data == blob_int8scale_table.end())
            continue;

        char key[256];
        sprintf(key, "%s_param_0", layers[i]->name.c_str());

        std::map<std::string, ncnn::Mat>::iterator iter = weight_int8scale_table.find(key);
        if (iter == weight_int8scale_table.end())
        {
            fprintf(stderr, "this layer need to be quantized, but no scale param!\n");
            return -1;
        }

        // Convolution - quantize weight from fp32 to int8
        ncnn::ConvolutionDepthWise* convdw = (ncnn::ConvolutionDepthWise*)layers[i];

        ncnn::Mat bottom_blob_int8_scales = iter_data->second;
        ncnn::Mat weight_data_int8_scales = iter->second;

        fprintf(stderr, "quantize_convolutiondepthwise %s\n", convdw->name.c_str());

        {
            ncnn::Mat int8_weight_data(convdw->weight_data_size, (size_t)1u);
            if (int8_weight_data.empty())
                return -100;

            const int weight_data_size_g = convdw->weight_data_size / convdw->group;

            for (int g = 0; g < convdw->group; g++)
            {
                ncnn::Option opt_q = opt;
                opt_q.blob_allocator = int8_weight_data.allocator;
                opt_q.use_packing_layout = false;

                const ncnn::Mat weight_data_g = convdw->weight_data.range(weight_data_size_g * g, weight_data_size_g);
                ncnn::Mat int8_weight_data_g = int8_weight_data.range(weight_data_size_g * g, weight_data_size_g);
                const ncnn::Mat weight_data_int8_scales_g = weight_data_int8_scales.range(g, 1);
                ncnn::quantize_to_int8(weight_data_g, int8_weight_data_g, weight_data_int8_scales_g, opt_q);
            }

            convdw->weight_data = int8_weight_data;
        }

        convdw->int8_scale_term = 1;
        convdw->weight_data_int8_scales = weight_data_int8_scales;
        convdw->bottom_blob_int8_scales = bottom_blob_int8_scales;
    }

    return 0;
}